

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

_Bool make_ranged_attack(monster_conflict *mon)

{
  short sVar1;
  bool bVar2;
  monster_conflict *pmVar3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  monster_lore *pmVar9;
  undefined7 extraout_var;
  long lVar10;
  loc lVar11;
  int iVar12;
  undefined4 uVar13;
  int iVar14;
  int iVar15;
  wchar_t tdist;
  bitflag ai_pflags [3];
  bitflag f2 [12];
  bitflag f [12];
  bitflag ai_flags [5];
  char m_name [80];
  int local_e8;
  bitflag local_e3 [3];
  bitflag local_e0 [12];
  bitflag local_d4 [12];
  monster_conflict *local_c8;
  int local_c0;
  undefined4 local_bc;
  bitflag local_b5 [5];
  loc local_b0;
  ulong local_a8;
  monster_lore *local_a0;
  element_info local_98 [26];
  
  pmVar9 = get_lore(mon->race);
  if (player->timed[2] == 0) {
    _Var4 = monster_is_visible((monster *)mon);
    uVar13 = (undefined4)CONCAT71(extraout_var,_Var4);
  }
  else {
    uVar13 = 0;
  }
  _Var4 = monster_can_cast(mon,false);
  if ((_Var4) || (_Var5 = monster_can_cast(mon,true), _Var5)) {
    local_bc = uVar13;
    local_a0 = pmVar9;
    flag_copy(local_d4,mon->race->spell_flags,0xc);
    _Var5 = monster_is_smart((monster *)mon);
    if ((_Var5) && ((mon->hp < mon->maxhp / 10 && (uVar6 = Rand_div(2), uVar6 == 0)))) {
      ignore_spells(local_d4,L'\x0f');
    }
    local_c8 = mon;
    _Var5 = monster_is_stupid((monster *)mon);
    pmVar3 = local_c8;
    if (!_Var5) {
      monster_get_target_dist_grid(local_c8,&local_e8,(loc *)0x0);
      flag_copy(local_e0,local_d4,0xc);
      if (pmVar3->maxhp <= pmVar3->hp) {
        flag_off(local_e0,0xc,0x40);
      }
      _Var5 = flag_has_dbg(local_e0,0xc,0x41,"f2","RSF_HEAL_KIN");
      if ((_Var5) && (_Var5 = find_any_nearby_injured_kin((chunk *)cave,pmVar3), !_Var5)) {
        flag_off(local_e0,0xc,0x41);
      }
      if (10 < pmVar3->m_timed[5]) {
        flag_off(local_e0,0xc,0x3f);
      }
      if (local_e8 == 1) {
        flag_off(local_e0,0xc,0x44);
        flag_off(local_e0,0xc,0x45);
      }
      if (2 < local_e8) {
        flag_off(local_e0,0xc,2);
      }
      if (3 < local_e8) {
        flag_off(local_e0,0xc,3);
      }
      if ((player->opts).opt[0x28] == true) {
        uVar6 = Rand_div(0x14);
        if (uVar6 == 0) {
          flag_wipe((pmVar3->known_pstate).flags,5);
          flag_wipe((pmVar3->known_pstate).pflags,3);
          lVar10 = 0;
          do {
            (pmVar3->known_pstate).el_info[lVar10].res_level = 0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x19);
        }
        flag_wipe(local_b5,5);
        flag_wipe(local_e3,3);
        flag_copy(local_b5,(pmVar3->known_pstate).flags,5);
        flag_copy(local_e3,(pmVar3->known_pstate).pflags,3);
        _Var5 = flag_is_empty(local_b5,5);
        if ((_Var5) && (_Var5 = flag_is_empty(local_e3,3), _Var5)) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
        }
        lVar10 = 0;
        do {
          sVar1 = (pmVar3->known_pstate).el_info[lVar10].res_level;
          local_98[lVar10].res_level = sVar1;
          if (sVar1 != 0) {
            bVar2 = true;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x19);
        if (bVar2) {
          unset_spells(local_e0,local_b5,local_e3,local_98,pmVar3);
        }
      }
      flag_copy(local_d4,local_e0,0xc);
      _Var5 = monster_is_decoyed((monster *)pmVar3);
      if (_Var5) {
        lVar11 = cave_find_decoy(cave);
      }
      else {
        lVar11.x = (player->grid).x;
        lVar11.y = (player->grid).y;
      }
      _Var5 = test_spells(local_d4,L'\x01');
      if ((_Var5) && (_Var5 = projectable((chunk *)cave,pmVar3->grid,lVar11,L'\b'), !_Var5)) {
        ignore_spells(local_d4,L'\x01');
      }
      if (player->upkeep->arena_level == false) {
        local_b0 = local_c8->grid;
        local_a8 = (ulong)(uint)(local_b0.y + L'\x02');
        wVar7 = local_b0.x;
        local_c0 = wVar7 + L'\xfffffffd';
        iVar15 = local_b0.y + L'\xfffffffe';
        iVar12 = local_c0;
        do {
          do {
            iVar12 = iVar12 + 1;
            lVar11 = (loc)loc(iVar12,iVar15);
            _Var5 = square_in_bounds(cave,lVar11);
            iVar14 = 7;
            if (((_Var5) &&
                (wVar8 = distance((loc_conflict)local_b0,(loc_conflict)lVar11), wVar8 < L'\x03')) &&
               (_Var5 = square_iswarded(cave,lVar11), !_Var5)) {
              _Var5 = square_isempty(cave,lVar11);
              if (_Var5) {
                _Var5 = los(cave,(loc_conflict)local_b0,(loc_conflict)lVar11);
                iVar14 = 1;
                if (_Var5) goto LAB_001650d6;
              }
              iVar14 = 0;
            }
LAB_001650d6:
            if ((iVar14 != 7) && (iVar14 != 0)) goto LAB_00164f1d;
          } while (iVar12 < wVar7 + L'\x02');
          bVar2 = iVar15 < (int)local_a8;
          iVar15 = iVar15 + 1;
          iVar12 = local_c0;
        } while (bVar2);
      }
      ignore_spells(local_d4,L'Ѐ');
    }
LAB_00164f1d:
    _Var5 = flag_is_empty(local_d4,0xc);
    if ((!_Var5) &&
       (wVar7 = choose_attack_spell(local_d4,!_Var4,_Var4), pmVar3 = local_c8, wVar7 != L'\0')) {
      monster_desc((char *)local_98,0x50,(monster *)local_c8,L'̔');
      _Var4 = monster_is_camouflaged((monster *)pmVar3);
      if (_Var4) {
        become_aware((chunk *)cave,pmVar3);
      }
      wVar8 = pmVar3->race->spell_power;
      iVar15 = 0x18;
      if (wVar8 < L'\x02') {
        iVar15 = wVar8 + L'\x06';
        if (-1 < wVar8 + L'\x03') {
          iVar15 = wVar8 + L'\x03';
        }
        iVar15 = 0x19 - (iVar15 >> 2);
      }
      _Var4 = monster_is_stupid((monster *)pmVar3);
      iVar12 = 0;
      if (!_Var4) {
        iVar12 = iVar15 + 0x14;
        if (pmVar3->m_timed[3] == 0) {
          iVar12 = iVar15;
        }
        if ((pmVar3->m_timed[2] != 0) || (pmVar3->m_timed[7] != 0)) {
          iVar12 = iVar12 + 0x32;
        }
      }
      _Var4 = mon_spell_is_innate(wVar7);
      if ((_Var4) || (uVar6 = Rand_div(100), iVar12 <= (int)uVar6)) {
        disturb(player);
        _Var4 = local_bc._0_1_;
        do_mon_spell(wVar7,pmVar3,local_bc._0_1_);
        pmVar9 = local_a0;
        if (_Var4 != false) {
          flag_on_dbg(local_a0->spell_flags,0xc,wVar7,"lore->spell_flags","thrown_spell");
          _Var4 = mon_spell_is_innate(wVar7);
          if (_Var4) {
            if (pmVar9->cast_innate != 0xff) {
              pmVar9->cast_innate = pmVar9->cast_innate + '\x01';
            }
          }
          else if (pmVar9->cast_spell != 0xff) {
            pmVar9->cast_spell = pmVar9->cast_spell + '\x01';
          }
        }
        if ((player->is_dead == true) && (pmVar9->deaths < 0x7fff)) {
          pmVar9->deaths = pmVar9->deaths + 1;
        }
        lore_update(pmVar3->race,pmVar9);
      }
      else {
        msg("%s tries to cast a spell, but fails.",local_98);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool make_ranged_attack(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int thrown_spell, failrate;
	bitflag f[RSF_SIZE];
	char m_name[80];
	bool seen = (player->timed[TMD_BLIND] == 0) && monster_is_visible(mon);
	bool innate = false;

	/* Check for cast this turn, non-innate and then innate */
	if (!monster_can_cast(mon, false)) {
		if (!monster_can_cast(mon, true)) {
			return false;
		} else {
			/* We're casting an innate "spell" */
			innate = true;
		}
	}

	/* Extract the racial spell flags */
	rsf_copy(f, mon->race->spell_flags);

	/* Smart monsters can use "desperate" spells */
	if (monster_is_smart(mon) && mon->hp < mon->maxhp / 10 && one_in_(2)) {
		ignore_spells(f, RST_DAMAGE);
	}

	/* Non-stupid monsters do some filtering */
	if (!monster_is_stupid(mon)) {
		struct loc tgrid;

		/* Remove the "ineffective" spells */
		remove_bad_spells(mon, f);

		/* Check for a clean bolt shot */
		monster_get_target_dist_grid(mon, NULL, &tgrid);
		if (test_spells(f, RST_BOLT) &&
			!projectable(cave, mon->grid, tgrid, PROJECT_STOP)) {
			ignore_spells(f, RST_BOLT);
		}

		/* Check for a possible summon */
		if (!summon_possible(mon->grid)) {
			ignore_spells(f, RST_SUMMON);
		}
	}

	/* No spells left */
	if (rsf_is_empty(f)) return false;

	/* Choose a spell to cast */
	thrown_spell = choose_attack_spell(f, innate, !innate);

	/* Abort if no spell was chosen */
	if (!thrown_spell) return false;

	/* There will be at least an attempt now, so get the monster's name */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* If we see a hidden monster try to cast a spell, become aware of it */
	if (monster_is_camouflaged(mon))
		become_aware(cave, mon);

	/* Check for spell failure (innate attacks never fail) */
	failrate = monster_spell_failrate(mon);
	if (!mon_spell_is_innate(thrown_spell) && (randint0(100) < failrate)) {
		msg("%s tries to cast a spell, but fails.", m_name);
		return true;
	}

	/* Cast the spell. */
	disturb(player);
	do_mon_spell(thrown_spell, mon, seen);

	/* Remember what the monster did */
	if (seen) {
		rsf_on(lore->spell_flags, thrown_spell);
		if (mon_spell_is_innate(thrown_spell)) {
			/* Innate spell */
			if (lore->cast_innate < UCHAR_MAX)
				lore->cast_innate++;
		} else {
			/* Bolt or Ball, or Special spell */
			if (lore->cast_spell < UCHAR_MAX)
				lore->cast_spell++;
		}
	}
	if (player->is_dead && (lore->deaths < SHRT_MAX)) {
		lore->deaths++;
	}
	lore_update(mon->race, lore);

	/* A spell was cast */
	return true;
}